

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

StackSym * __thiscall Func::GetStackSymForFormal(Func *this,ArgSlot formalsIndex)

{
  code *pcVar1;
  bool bVar2;
  ArgSlot AVar3;
  StackSym **ppSVar4;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar5;
  StackSym **formalsIndexToStackSymMap;
  ArgSlot formalsCount;
  ArgSlot formalsIndex_local;
  Func *this_local;
  
  if ((this->stackArgWithFormalsTracker != (StackArgWithFormalsTracker *)0x0) &&
     (ppSVar4 = StackArgWithFormalsTracker::GetFormalsIndexToStackSymMap
                          (this->stackArgWithFormalsTracker), ppSVar4 != (StackSym **)0x0)) {
    this_00 = GetJITFunctionBody(this);
    AVar3 = JITTimeFunctionBody::GetInParamsCount(this_00);
    ppSVar4 = StackArgWithFormalsTracker::GetFormalsIndexToStackSymMap
                        (this->stackArgWithFormalsTracker);
    if ((ushort)(AVar3 - 1) <= formalsIndex) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x716,"(formalsIndex < formalsCount)","OutOfRange ? ");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    return ppSVar4[formalsIndex];
  }
  return (StackSym *)0x0;
}

Assistant:

StackSym *
Func::GetStackSymForFormal(Js::ArgSlot formalsIndex)
{
    if (stackArgWithFormalsTracker == nullptr || stackArgWithFormalsTracker->GetFormalsIndexToStackSymMap() == nullptr)
    {
        return nullptr;
    }

    Js::ArgSlot formalsCount = GetJITFunctionBody()->GetInParamsCount() - 1;
    StackSym ** formalsIndexToStackSymMap = stackArgWithFormalsTracker->GetFormalsIndexToStackSymMap();
    AssertMsg(formalsIndex < formalsCount, "OutOfRange ? ");
    return formalsIndexToStackSymMap[formalsIndex];
}